

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  bool bVar1;
  byte local_29;
  SPIRType *local_20;
  SPIRType *type;
  uint32_t type_id_local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  local_20 = get<diligent_spirv_cross::SPIRType>(this->compiler,type_id);
  type._4_4_ = type_id;
  while( true ) {
    bVar1 = is_physical_pointer(this->compiler,local_20);
    local_29 = 0;
    if (bVar1) {
      bVar1 = type_is_bda_block_entry(this,type._4_4_);
      local_29 = bVar1 ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->parent_type);
    local_20 = get<diligent_spirv_cross::SPIRType>(this->compiler,type._4_4_);
  }
  bVar1 = type_is_bda_block_entry(this,type._4_4_);
  if (bVar1) {
    return type._4_4_;
  }
  __assert_fail("type_is_bda_block_entry(type_id)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                ,0x149b,
                "uint32_t diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t) const"
               );
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t type_id) const
{
	auto *type = &compiler.get<SPIRType>(type_id);
	while (compiler.is_physical_pointer(*type) && !type_is_bda_block_entry(type_id))
	{
		type_id = type->parent_type;
		type = &compiler.get<SPIRType>(type_id);
	}

	assert(type_is_bda_block_entry(type_id));
	return type_id;
}